

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<unsigned_long_long>>
               (char *label_id,GetterXsYs<unsigned_long_long> *getter,double width)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  unsigned_long_long *puVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  long lVar14;
  ImDrawList *this;
  int iVar15;
  int iVar16;
  int iVar17;
  ImPlotRange *pIVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  ImVec2 b;
  ImVec2 a;
  byte local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  unsigned_long_long *local_48;
  double dStack_40;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar28 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar15 = getter->Count, 0 < iVar15)) {
      local_48 = getter->Xs;
      puVar8 = getter->Ys;
      iVar17 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar5 = pIVar9->CurrentYAxis;
      uVar6 = (pIVar9->XAxis).Flags;
      pIVar18 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar9->YAxis[iVar5].Flags;
      iVar16 = 0;
      do {
        lVar14 = (long)(((iVar17 + iVar16) % iVar15 + iVar15) % iVar15) * (long)iVar4;
        uVar1 = *(unsigned_long_long *)((long)local_48 + lVar14);
        auVar25._8_4_ = (int)(uVar1 >> 0x20);
        auVar25._0_8_ = uVar1;
        auVar25._12_4_ = 0x45300000;
        dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)puVar8 + lVar14);
        auVar27._8_4_ = (int)(uVar1 >> 0x20);
        auVar27._0_8_ = uVar1;
        auVar27._12_4_ = 0x45300000;
        dVar24 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        dVar26 = dVar23 - dVar28;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar26) < 0x7ff0000000000000) {
LAB_001f4b55:
            if ((0.0 < dVar26) || ((uVar6 & 0x20) == 0)) {
              dVar10 = (pIVar12->ExtentsX).Min;
              dVar11 = (pIVar12->ExtentsX).Max;
              uVar19 = -(ulong)(dVar26 < dVar10);
              uVar20 = -(ulong)(dVar11 < dVar26);
              (pIVar12->ExtentsX).Min = (double)(~uVar19 & (ulong)dVar10 | (ulong)dVar26 & uVar19);
              (pIVar12->ExtentsX).Max = (double)(~uVar20 & (ulong)dVar11 | (ulong)dVar26 & uVar20);
            }
          }
        }
        else if ((((long)ABS(dVar26) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= dVar24)) &&
                (dVar24 <= pIVar9->YAxis[iVar5].Range.Max)) goto LAB_001f4b55;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar1 != 0) || ((uVar7 & 0x20) == 0)) {
LAB_001f4bda:
            dVar26 = pIVar12->ExtentsY[iVar5].Max;
            uVar19 = -(ulong)(dVar24 < pIVar18->Min);
            uVar20 = -(ulong)(dVar26 < dVar24);
            pIVar18->Min = (double)(~uVar19 & (ulong)pIVar18->Min | (ulong)dVar24 & uVar19);
            pIVar12->ExtentsY[iVar5].Max =
                 (double)(~uVar20 & (ulong)dVar26 | (ulong)dVar24 & uVar20);
          }
        }
        else if ((((pIVar9->XAxis).Range.Min <= dVar26) && (dVar26 <= (pIVar9->XAxis).Range.Max)) &&
                (local_60 = (byte)((uVar7 & 0x20) >> 5), (uVar1 == 0 & local_60) == 0))
        goto LAB_001f4bda;
        dVar23 = dVar23 + dVar28;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar23) < 0x7ff0000000000000) {
LAB_001f4c43:
            if ((0.0 < dVar23) || ((uVar6 & 0x20) == 0)) {
              dVar24 = (pIVar12->ExtentsX).Min;
              dVar26 = (pIVar12->ExtentsX).Max;
              uVar19 = -(ulong)(dVar23 < dVar24);
              uVar20 = -(ulong)(dVar26 < dVar23);
              (pIVar12->ExtentsX).Min = (double)(~uVar19 & (ulong)dVar24 | (ulong)dVar23 & uVar19);
              (pIVar12->ExtentsX).Max = (double)(~uVar20 & (ulong)dVar26 | (ulong)dVar23 & uVar20);
            }
          }
        }
        else if ((((long)ABS(dVar23) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar5].Range.Min <= 0.0)) && (0.0 <= pIVar9->YAxis[iVar5].Range.Max)
                ) goto LAB_001f4c43;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((uVar7 & 0x20) == 0) {
LAB_001f4cb6:
            dVar23 = pIVar12->ExtentsY[iVar5].Max;
            pIVar18->Min = (double)(-(ulong)(pIVar18->Min <= 0.0) & (ulong)pIVar18->Min);
            pIVar12->ExtentsY[iVar5].Max = (double)(-(ulong)(0.0 <= dVar23) & (ulong)dVar23);
          }
        }
        else if ((((uVar7 & 0x20) == 0) && ((pIVar9->XAxis).Range.Min <= dVar23)) &&
                (dVar23 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f4cb6;
        iVar16 = iVar16 + 1;
      } while (iVar15 != iVar16);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar15 = getter->Count;
    if (0 < iVar15) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar3 = (pIVar12->NextItemData).RenderLine;
      iVar17 = 0;
      do {
        lVar14 = (long)(((getter->Offset + iVar17) % iVar15 + iVar15) % iVar15) *
                 (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar14);
        if (uVar1 != 0) {
          auVar21._8_4_ = (int)(uVar1 >> 0x20);
          auVar21._0_8_ = uVar1;
          auVar21._12_4_ = 0x45300000;
          uVar2 = *(unsigned_long_long *)((long)getter->Xs + lVar14);
          auVar22._8_4_ = (int)(uVar2 >> 0x20);
          auVar22._0_8_ = uVar2;
          auVar22._12_4_ = 0x45300000;
          dStack_40 = auVar22._8_8_ - 1.9342813113834067e+25;
          local_48 = (unsigned_long_long *)
                     (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
          local_50 = PlotToPixels((double)local_48 - dVar28,
                                  (auVar21._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),-1)
          ;
          local_58 = PlotToPixels((double)local_48 + dVar28,0.0,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_50,&local_58,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_50,&local_58,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
          iVar15 = getter->Count;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar15);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}